

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter.h
# Opt level: O3

void __thiscall
winmd::reader::filter::
filter<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
          (filter *this,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *includes,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *excludes)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer ppVar2;
  pointer ppVar3;
  long lVar4;
  _Base_ptr p_Var5;
  ulong uVar6;
  _Rb_tree_header *p_Var7;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
  local_58;
  
  (this->m_rules).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_rules).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_rules).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var5 = (includes->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var7 = &(includes->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var5 != p_Var7) {
    paVar1 = &local_58.first.field_2;
    do {
      local_58.first._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_58,*(long *)(p_Var5 + 1),
                 (long)&(p_Var5[1]._M_parent)->_M_color + *(long *)(p_Var5 + 1));
      local_58.second = true;
      std::
      vector<std::pair<std::__cxx11::string,bool>,std::allocator<std::pair<std::__cxx11::string,bool>>>
      ::emplace_back<std::pair<std::__cxx11::string,bool>>
                ((vector<std::pair<std::__cxx11::string,bool>,std::allocator<std::pair<std::__cxx11::string,bool>>>
                  *)this,&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58.first._M_dataplus._M_p != paVar1) {
        operator_delete(local_58.first._M_dataplus._M_p,
                        local_58.first.field_2._M_allocated_capacity + 1);
      }
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    } while ((_Rb_tree_header *)p_Var5 != p_Var7);
  }
  p_Var5 = (excludes->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var7 = &(excludes->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var5 != p_Var7) {
    paVar1 = &local_58.first.field_2;
    do {
      local_58.first._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_58,*(long *)(p_Var5 + 1),
                 (long)&(p_Var5[1]._M_parent)->_M_color + *(long *)(p_Var5 + 1));
      local_58.second = false;
      std::
      vector<std::pair<std::__cxx11::string,bool>,std::allocator<std::pair<std::__cxx11::string,bool>>>
      ::emplace_back<std::pair<std::__cxx11::string,bool>>
                ((vector<std::pair<std::__cxx11::string,bool>,std::allocator<std::pair<std::__cxx11::string,bool>>>
                  *)this,&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58.first._M_dataplus._M_p != paVar1) {
        operator_delete(local_58.first._M_dataplus._M_p,
                        local_58.first.field_2._M_allocated_capacity + 1);
      }
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    } while ((_Rb_tree_header *)p_Var5 != p_Var7);
  }
  ppVar2 = (this->m_rules).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar3 = (this->m_rules).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar2 != ppVar3) {
    uVar6 = ((long)ppVar3 - (long)ppVar2 >> 3) * -0x3333333333333333;
    lVar4 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar6 >> lVar4 == 0; lVar4 = lVar4 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,bool>*,std::vector<std::pair<std::__cxx11::string,bool>,std::allocator<std::pair<std::__cxx11::string,bool>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<winmd::reader::filter::filter<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>(std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>const&,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>const&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
              (ppVar2,ppVar3,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,bool>*,std::vector<std::pair<std::__cxx11::string,bool>,std::allocator<std::pair<std::__cxx11::string,bool>>>>,__gnu_cxx::__ops::_Iter_comp_iter<winmd::reader::filter::filter<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>(std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>const&,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>const&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
              (ppVar2,ppVar3);
  }
  return;
}

Assistant:

filter(T const& includes, T const& excludes)
        {
            for (auto&& include : includes)
            {
                m_rules.push_back({ include, true });
            }

            for (auto&& exclude : excludes)
            {
                m_rules.push_back({ exclude, false });
            }

            std::sort(m_rules.begin(), m_rules.end(), [](auto const& lhs, auto const& rhs)
            {
                return std::pair{ lhs.first.size(), !lhs.second } > std::pair{ rhs.first.size(), !rhs.second };
            });
        }